

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined8 uVar5;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  Allocator *pAVar12;
  unsigned_long uVar13;
  Mat *this_00;
  bool bVar14;
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  pointer pfVar21;
  ulong uVar22;
  int *piVar23;
  pointer pfVar24;
  pointer pBVar25;
  float *pfVar26;
  pointer pBVar27;
  float *pfVar28;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  ulong uVar32;
  pointer pMVar33;
  int j;
  long lVar34;
  float *pfVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  size_t i;
  long lVar39;
  float *pfVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  uint local_208;
  uint uStack_204;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  int local_19c;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  float *local_100;
  vector<int,_std::allocator<int>_> softmax_rets;
  float local_d8;
  float fStack_d4;
  value_type local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar32 = 0;
  while( true ) {
    pMVar33 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar33) / 0x48) <= uVar32
       ) break;
    iVar37 = pMVar33[uVar32].c / this->num_box;
    if (iVar37 != this->num_class + 5) {
      iVar38 = -1;
      goto LAB_003f38ce;
    }
    uVar3 = pMVar33[uVar32].w;
    uVar6 = pMVar33[uVar32].h;
    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)&picked,(long)this->num_box);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&bbox_scores,(long)this->num_box);
    softmax_rets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    softmax_rets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    softmax_rets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&softmax_rets,(long)this->num_box);
    pMVar33 = pMVar33 + uVar32;
    uVar16 = uVar3;
    if ((int)uVar3 < 1) {
      uVar16 = 0;
    }
    uVar17 = uVar6;
    if ((int)uVar6 < 1) {
      uVar17 = 0;
    }
    auVar15._4_4_ = (float)(int)uVar6;
    auVar15._0_4_ = (float)(int)uVar3;
    auVar15._8_8_ = 0;
    local_58 = divps(_DAT_005353b0,auVar15);
    for (lVar29 = 0; uVar19 = (ulong)this->num_box, lVar29 < (long)uVar19; lVar29 = lVar29 + 1) {
      lVar39 = lVar29 * iVar37;
      uVar5 = *(undefined8 *)((long)(this->biases).data + lVar29 * 8);
      pvVar10 = pMVar33->data;
      pBVar25 = (pointer)pMVar33->elemsize;
      sVar11 = pMVar33->cstep;
      iVar38 = pMVar33->w;
      iVar8 = pMVar33->h;
      iVar9 = pMVar33->d;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((lVar39 + 5) * sVar11 * (long)pBVar25 + (long)pvVar10);
      pAVar12 = pMVar33->allocator;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pBVar25;
      iVar18 = (*this->softmax->_vptr_Layer[9])(this->softmax,&bbox_rects,opt);
      lVar34 = sVar11 * (long)pBVar25;
      local_100 = (float *)((lVar39 + 4) * lVar34 + (long)pvVar10);
      pfVar26 = (float *)((lVar39 + 3) * lVar34 + (long)pvVar10);
      pfVar28 = (float *)((lVar39 + 2) * lVar34 + (long)pvVar10);
      pfVar40 = (float *)((lVar39 + 1) * lVar34 + (long)pvVar10);
      pfVar35 = (float *)(lVar34 * lVar39 + (long)pvVar10);
      softmax_rets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar29] = iVar18;
      local_d8 = (float)uVar5;
      fStack_d4 = (float)((ulong)uVar5 >> 0x20);
      for (uVar19 = 0; uVar19 != uVar17; uVar19 = uVar19 + 1) {
        lVar34 = 0;
        for (uVar36 = 0; uVar36 != uVar16; uVar36 = uVar36 + 1) {
          fVar41 = expf(-*pfVar35);
          fVar44 = (1.0 / (fVar41 + 1.0) + (float)(int)uVar36) * (1.0 / (float)(int)uVar3);
          fVar41 = expf(-*pfVar40);
          local_48 = ZEXT416((uint)(1.0 / (fVar41 + 1.0) + (float)(int)uVar19));
          fVar41 = *pfVar28;
          fVar42 = expf(*pfVar26);
          fVar41 = expf(fVar41);
          fVar41 = fVar41 * local_d8 * 0.5 * (float)local_58._0_4_;
          fVar43 = fVar42 * fStack_d4 * 0.5 * (float)local_58._4_4_;
          fVar42 = expf(-*local_100);
          uVar30 = 0;
          uVar22 = (ulong)(uint)this->num_class;
          if (this->num_class < 1) {
            uVar22 = uVar30;
          }
          pfVar31 = (float *)((long)&(bbox_rects.
                                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->xmin +
                             uVar19 * (long)bbox_rects.
                                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage *
                             (long)iVar38 + lVar34);
          fVar45 = 0.0;
          uVar20 = 0;
          for (; uVar22 != uVar30; uVar30 = uVar30 + 1) {
            fVar47 = *pfVar31;
            bVar14 = fVar45 < fVar47;
            if (fVar45 <= fVar47) {
              fVar45 = fVar47;
            }
            if (bVar14) {
              uVar20 = uVar30 & 0xffffffff;
            }
            pfVar31 = (float *)((long)pfVar31 +
                               (long)bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage *
                               (((long)iVar9 * (long)pBVar25 * (long)iVar8 * (long)iVar38 + 0xfU &
                                0xfffffffffffffff0) / (ulong)pBVar25));
          }
          confidence = fVar45 / (fVar42 + 1.0);
          if (this->confidence_threshold <= confidence) {
            fVar42 = local_48._0_4_ * (1.0 / (float)(int)uVar6);
            local_70.ymax = fVar43 + fVar42;
            local_70.xmin = fVar44 - fVar41;
            local_70.ymin = fVar42 - fVar43;
            local_70.label = (int)uVar20;
            local_70.xmax = fVar44 + fVar41;
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       (picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar29 * 3),&local_70);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar29 * 6),&confidence);
          }
          pfVar35 = pfVar35 + 1;
          pfVar40 = pfVar40 + 1;
          pfVar28 = pfVar28 + 1;
          pfVar26 = pfVar26 + 1;
          local_100 = local_100 + 1;
          lVar34 = lVar34 + 4;
        }
      }
      if (bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        (bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish)->xmin =
             (float)((int)(bbox_rects.
                           super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->xmin + -1);
        UNLOCK();
        if ((bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
             super__Vector_impl_data._M_finish)->xmin == 0.0) {
          if (pAVar12 == (Allocator *)0x0) {
            free(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_start);
          }
          else {
            (*pAVar12->_vptr_Allocator[3])();
          }
        }
      }
    }
    lVar29 = 2;
    for (lVar34 = 0;
        (pfVar21 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start, iVar38 = local_19c, lVar34 < (int)uVar19 &&
        (iVar38 = softmax_rets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar34],
        softmax_rets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar34] == 0)); lVar34 = lVar34 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar29 * 4 + -8),
                 *(BBoxRect **)
                  ((long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar29 * 4));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&all_bbox_scores,
                 (const_iterator)
                 all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)(pfVar21 + lVar29 + -2),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)(pfVar21 + lVar29));
      uVar19 = (ulong)(uint)this->num_box;
      lVar29 = lVar29 + 6;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&softmax_rets.super__Vector_base<int,_std::allocator<int>_>);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)&bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)&picked);
    uVar32 = uVar32 + 1;
    local_19c = iVar38;
    if (lVar34 < (int)uVar19) goto LAB_003f38ce;
  }
  if ((all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_start !=
       all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start !=
      all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    qsort_descent_inplace<ncnn::BBoxRect>
              (&all_bbox_rects,&all_bbox_scores,0,
               (int)((ulong)((long)all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
  }
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar41 = this->nms_threshold;
  pfVar21 = (pointer)(((long)all_bbox_rects.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)all_bbox_rects.
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x14);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&bbox_rects,(size_type)pfVar21,
             (allocator_type *)&bbox_scores);
  pfVar35 = &(all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
              _M_impl.super__Vector_impl_data._M_start)->xmax;
  for (pfVar24 = (pointer)0x0; pfVar21 != pfVar24; pfVar24 = (pointer)((long)pfVar24 + 1)) {
    uVar4 = ((BBoxRect *)(pfVar35 + -2))->xmin;
    uVar7 = ((BBoxRect *)(pfVar35 + -2))->ymin;
    (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_start)->xmin)[(long)pfVar24] =
         ((float)((ulong)*(undefined8 *)pfVar35 >> 0x20) - (float)uVar7) *
         ((float)*(undefined8 *)pfVar35 - (float)uVar4);
    pfVar35 = pfVar35 + 5;
  }
  for (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
       ._M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start < pfVar21;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1)) {
    pBVar25 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
              _M_impl.super__Vector_impl_data._M_start +
              (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
    uVar19 = (ulong)((long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar32 = uVar19 & 0xffffffff;
    if ((int)uVar19 < 1) {
      uVar32 = 0;
    }
    uVar19 = 1;
    for (uVar36 = 0; uVar32 != uVar36; uVar36 = uVar36 + 1) {
      uVar13 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar36];
      fVar42 = pBVar25->xmin;
      fVar43 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13].xmax;
      fVar44 = 0.0;
      if (fVar42 <= fVar43) {
        pBVar27 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar13;
        fVar45 = pBVar25->xmax;
        fVar47 = pBVar27->xmin;
        if (fVar47 <= fVar45) {
          fVar1 = pBVar25->ymin;
          fVar46 = pBVar27->ymax;
          if (fVar1 <= fVar46) {
            fVar2 = pBVar25->ymax;
            fVar48 = pBVar27->ymin;
            if (fVar48 <= fVar2) {
              if (fVar45 <= fVar43) {
                fVar43 = fVar45;
              }
              if (fVar47 <= fVar42) {
                fVar47 = fVar42;
              }
              if (fVar2 <= fVar46) {
                fVar46 = fVar2;
              }
              if (fVar48 <= fVar1) {
                fVar48 = fVar1;
              }
              fVar44 = (fVar46 - fVar48) * (fVar43 - fVar47);
            }
          }
        }
      }
      if (fVar41 < fVar44 / (((&(bbox_rects.
                                 super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->xmin)
                              [(long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start] - fVar44) +
                            (&(bbox_rects.
                               super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                               _M_impl.super__Vector_impl_data._M_start)->xmin)[uVar13])) {
        uVar19 = 0;
      }
    }
    if ((int)uVar19 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&picked,(value_type_conflict5 *)&bbox_scores);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
  bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (uVar32 = 0;
      uVar32 < (ulong)((long)picked.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)picked.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar32 = uVar32 + 1) {
    uVar13 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar32];
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
              (&bbox_rects,
               all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar13);
    std::vector<float,_std::allocator<float>_>::push_back
              (&bbox_scores,
               all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar13);
  }
  uVar32 = ((long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x14;
  iVar37 = (int)uVar32;
  if (iVar37 == 0) {
    iVar38 = 0;
  }
  else {
    this_00 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,6,iVar37,4,opt->blob_allocator);
    pvVar10 = this_00->data;
    iVar38 = -100;
    if ((pvVar10 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar38 = 0;
      uVar32 = uVar32 & 0xffffffff;
      if (iVar37 < 1) {
        uVar32 = 0;
      }
      piVar23 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start)->label;
      for (uVar19 = 0; uVar32 != uVar19; uVar19 = uVar19 + 1) {
        fVar41 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19];
        lVar29 = (long)this_00->w * uVar19 * this_00->elemsize;
        *(float *)((long)pvVar10 + lVar29) = (float)*piVar23 + 1.0;
        *(float *)((long)pvVar10 + lVar29 + 4) = fVar41;
        *(float *)((long)pvVar10 + lVar29 + 8) = ((BBoxRect *)(piVar23 + -4))->xmin;
        *(int *)((long)pvVar10 + lVar29 + 0xc) = piVar23[-3];
        *(int *)((long)pvVar10 + lVar29 + 0x10) = piVar23[-2];
        *(int *)((long)pvVar10 + lVar29 + 0x14) = piVar23[-1];
        piVar23 = piVar23 + 5;
      }
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
            (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_003f38ce:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
            (&all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
  return iVar38;
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        std::vector<int> softmax_rets;
        softmax_rets.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax_rets[pp] = softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = expf(wptr[0]) * bias_w / w;
                    float bbox_h = expf(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            if (softmax_rets[i] != 0)
                return softmax_rets[i];

            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}